

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O0

int bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  mapped_type *this;
  Register in_register_00000014;
  undefined4 in_register_0000003c;
  key_type local_90;
  int local_8c;
  Hcell local_88;
  sockaddr *local_58;
  Machine *m_local;
  undefined1 local_40 [8];
  Addr toStore_local;
  undefined1 local_20 [8];
  Addr storeLoc_local;
  
  unique0x10000043 = in_register_00000014.r;
  toStore_local.hix_.hix = __len;
  local_58 = __addr;
  local_20 = (undefined1  [8])unique0x1000003f;
  unique0x100000cf = (Machine *)CONCAT44(in_register_0000003c,__fd);
  local_8c = (int)Addr::hix((Addr *)local_40);
  Hcell::ref(&local_88,(Hix)local_8c);
  local_90.hix = (int)Addr::hix((Addr *)local_20);
  this = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
         operator[]((map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                     *)__addr,&local_90);
  Hcell::operator=(this,&local_88);
  Hcell::~Hcell(&local_88);
  Machine::Machine((Machine *)CONCAT44(in_register_0000003c,__fd),(Machine *)__addr);
  return __fd;
}

Assistant:

Machine bind(Machine m, Addr storeLoc, Addr toStore) {
    m.heap[storeLoc.hix()] = Hcell::ref(toStore.hix());
    return m;
}